

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_window.cpp
# Opt level: O2

void __thiscall
duckdb::WindowHashGroup::WindowHashGroup
          (WindowHashGroup *this,WindowGlobalSinkState *gstate,idx_t hash_bin_p)

{
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_00;
  RowLayout *this_01;
  idx_t *args_1;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_02;
  idx_t count;
  pointer puVar1;
  BoundWindowExpression *pBVar2;
  ulong *puVar3;
  pointer poVar4;
  __uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_> __p;
  type pWVar5;
  reference pvVar6;
  pointer pPVar7;
  atomic<unsigned_long> *paVar8;
  pointer pWVar9;
  TemplatedValidityMask<unsigned_long> *this_03;
  pointer pRVar10;
  type swizzled_block_collection;
  type swizzled_string_heap;
  type block_collection;
  type string_heap;
  __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  *__u;
  pointer pGVar11;
  Expression *pEVar12;
  BufferManager *args;
  __node_base *p_Var13;
  ulong uVar14;
  unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
  *this_04;
  unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true> *wexec;
  pointer this_05;
  optional_ptr<const_duckdb::Expression,_true> *expr;
  ValidityMask *this_06;
  pointer this_07;
  _Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  local_98;
  vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
  *local_80;
  unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>,_true>
  *local_78;
  __uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_> local_70
  ;
  vector<duckdb::LogicalType,_true> types;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  this_00 = &this->rows;
  this_01 = &this->layout;
  this->blocks = 0;
  (this->rows).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  (this->hash_group).
  super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
  .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false> =
       (_Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>)0x0;
  this->count = 0;
  (this->heap).
  super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
  .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl = (RowDataCollection *)0x0
  ;
  RowLayout::RowLayout(this_01);
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_mask =
       (unsigned_long *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
  super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->partition_mask).super_TemplatedValidityMask<unsigned_long>.capacity = 0x800;
  (this->order_masks)._M_h._M_buckets = &(this->order_masks)._M_h._M_single_bucket;
  (this->order_masks)._M_h._M_bucket_count = 1;
  (this->order_masks)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->order_masks)._M_h._M_element_count = 0;
  (this->order_masks)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stage)._M_i = SINK;
  (this->collection).
  super_unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>._M_t.
  super___uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
  .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl = (WindowCollection *)0x0;
  local_78 = &this->collection;
  (this->order_masks)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->order_masks)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->gestates).
  super_vector<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutorGlobalState,_std::default_delete<duckdb::WindowExecutorGlobalState>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->thread_states).
  super_vector<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  .
  super__Vector_base<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>,_std::allocator<duckdb::vector<duckdb::unique_ptr<duckdb::WindowExecutorLocalState,_std::default_delete<duckdb::WindowExecutorLocalState>,_true>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->hash_bin = hash_bin_p;
  (this->lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->lock).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tasks).super_vector<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>.
  super__Vector_base<duckdb::WindowSourceTask,_std::allocator<duckdb::WindowSourceTask>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->next_task = 0;
  (this->sunk).super___atomic_base<unsigned_long>._M_i = 0;
  (this->finalized).super___atomic_base<unsigned_long>._M_i = 0;
  (this->completed).super___atomic_base<unsigned_long>._M_i = 0;
  this->batch_base = 0;
  pWVar5 = unique_ptr<duckdb::WindowPartitionGlobalSinkState,_std::default_delete<duckdb::WindowPartitionGlobalSinkState>,_true>
           ::operator*(&gstate->global_partition);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_48,
             &(pWVar5->super_PartitionGlobalSinkState).payload_types.
              super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  RowLayout::Initialize(this_01,(vector<duckdb::LogicalType,_true> *)&local_48,true);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
  uVar14 = this->hash_bin;
  local_80 = &(pWVar5->super_PartitionGlobalSinkState).hash_groups;
  if (uVar14 < (ulong)((long)(pWVar5->super_PartitionGlobalSinkState).hash_groups.
                             super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pWVar5->super_PartitionGlobalSinkState).hash_groups.
                             super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    pvVar6 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
             ::get<true>(local_80,uVar14);
    uVar14 = this->hash_bin;
    if ((pvVar6->
        super_unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        )._M_t.
        super___uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::PartitionGlobalHashGroup_*,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
        .super__Head_base<0UL,_duckdb::PartitionGlobalHashGroup_*,_false>._M_head_impl !=
        (PartitionGlobalHashGroup *)0x0) {
      pvVar6 = vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
               ::get<true>(local_80,uVar14);
      pPVar7 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
               ::operator->(pvVar6);
      paVar8 = &pPVar7->count;
      goto LAB_0198ecdb;
    }
  }
  if (uVar14 != 0 ||
      (pWVar5->super_PartitionGlobalSinkState).rows.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl ==
      (RowDataCollection *)0x0) {
    return;
  }
  paVar8 = &(pWVar5->super_PartitionGlobalSinkState).count;
LAB_0198ecdb:
  args_1 = &this->count;
  this_06 = &this->partition_mask;
  count = (paVar8->super___atomic_base<unsigned_long>)._M_i;
  *args_1 = count;
  TemplatedValidityMask<unsigned_long>::Initialize
            (&this_06->super_TemplatedValidityMask<unsigned_long>,count);
  TemplatedValidityMask<unsigned_long>::SetAllInvalid
            (&this_06->super_TemplatedValidityMask<unsigned_long>,*args_1);
  p_Var13 = &(this->order_masks)._M_h._M_before_begin;
  puVar1 = (gstate->executors).
           super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_05 = (gstate->executors).
                 super_vector<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_05 != puVar1; this_05 = this_05 + 1
      ) {
    pWVar9 = unique_ptr<duckdb::WindowExecutor,_std::default_delete<duckdb::WindowExecutor>,_true>::
             operator->(this_05);
    pBVar2 = pWVar9->wexpr;
    local_98._M_impl.super__Vector_impl_data._M_start =
         (pointer)(((long)(pBVar2->orders).
                          super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                          .
                          super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar2->orders).
                         super_vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         .
                         super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         ._M_impl.super__Vector_impl_data._M_start) / 0x18 +
                  ((long)(pBVar2->partitions).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pBVar2->partitions).
                         super_vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3));
    this_03 = &::std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_duckdb::ValidityMask>,_std::allocator<std::pair<const_unsigned_long,_duckdb::ValidityMask>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->order_masks,(key_type *)&local_98)->
               super_TemplatedValidityMask<unsigned_long>;
    if (this_03->validity_mask == (unsigned_long *)0x0) {
      TemplatedValidityMask<unsigned_long>::Initialize(this_03,*args_1);
      TemplatedValidityMask<unsigned_long>::SetAllInvalid(this_03,*args_1);
    }
  }
  this->external = (pWVar5->super_PartitionGlobalSinkState).external;
  uVar14 = this->hash_bin;
  if (uVar14 == 0 &&
      (pWVar5->super_PartitionGlobalSinkState).rows.
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>.
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (RowDataCollection *)0x0) {
    this_02 = &(pWVar5->super_PartitionGlobalSinkState).rows;
    do {
      puVar3 = (this_06->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      *puVar3 = *puVar3 | 1;
      p_Var13 = p_Var13->_M_nxt;
      this_06 = (ValidityMask *)(p_Var13 + 2);
    } while (p_Var13 != (__node_base *)0x0);
    pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_02);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_02);
    RowDataCollection::CloneEmpty((RowDataCollection *)&local_98,SUB81(pRVar10,0));
    poVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)this_00,(pointer)poVar4);
    ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                 *)&local_98);
    this_04 = &(pWVar5->super_PartitionGlobalSinkState).strings;
    pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_04);
    unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>::
    operator->(this_04);
    RowDataCollection::CloneEmpty((RowDataCollection *)&local_98,SUB81(pRVar10,0));
    poVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
    local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->heap,(pointer)poVar4);
    ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                 *)&local_98);
    swizzled_block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(this_00);
    swizzled_string_heap =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(&this->heap);
    block_collection =
         unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
         ::operator*(this_02);
    string_heap = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
                  ::operator*(this_04);
    RowDataCollectionScanner::AlignHeapBlocks
              (swizzled_block_collection,swizzled_string_heap,block_collection,string_heap,this_01);
    this->external = true;
  }
  else if (uVar14 < (ulong)((long)(pWVar5->super_PartitionGlobalSinkState).hash_groups.
                                  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pWVar5->super_PartitionGlobalSinkState).hash_groups.
                                  super_vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                                  .
                                  super__Vector_base<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3)) {
    __u = (__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
           *)vector<duckdb::unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>,_true>
             ::get<true>(local_80,uVar14);
    ::std::
    __uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
    ::operator=((__uniq_ptr_impl<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>_>
                 *)this,__u);
    pPVar7 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
             ::operator->(&this->hash_group);
    PartitionGlobalHashGroup::ComputeMasks(pPVar7,this_06,&this->order_masks);
    pPVar7 = unique_ptr<duckdb::PartitionGlobalHashGroup,_std::default_delete<duckdb::PartitionGlobalHashGroup>,_true>
             ::operator->(&this->hash_group);
    pGVar11 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>
              ::operator->(&pPVar7->global_sort);
    this->external = pGVar11->external;
    MaterializeSortedData(this);
  }
  if ((this_00->
      super_unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>).
      _M_t.
      super___uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::RowDataCollection_*,_std::default_delete<duckdb::RowDataCollection>_>
      .super__Head_base<0UL,_duckdb::RowDataCollection_*,_false>._M_head_impl !=
      (RowDataCollection *)0x0) {
    pRVar10 = unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>,_true>
              ::operator->(this_00);
    this->blocks = (long)(pRVar10->blocks).
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(pRVar10->blocks).
                         super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         .
                         super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
  }
  WindowSharedExpressions::GetSortedExpressions
            ((vector<duckdb::optional_ptr<const_duckdb::Expression,_true>,_true> *)&local_98,
             &(gstate->shared).coll_shared);
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  for (this_07 = (pointer)local_98._M_impl.super__Vector_impl_data._M_start;
      this_07 != (pointer)local_98._M_impl.super__Vector_impl_data._M_finish;
      this_07 = (pointer)&this_07->count) {
    pEVar12 = optional_ptr<const_duckdb::Expression,_true>::operator->
                        ((optional_ptr<const_duckdb::Expression,_true> *)this_07);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType_const&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&types,
               &pEVar12->return_type);
  }
  args = BufferManager::GetBufferManager(gstate->context);
  make_uniq<duckdb::WindowCollection,duckdb::BufferManager&,unsigned_long&,duckdb::vector<duckdb::LogicalType,true>&>
            ((duckdb *)&local_70,args,args_1,&types);
  __p._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
  .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl =
       local_70._M_t.
       super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
       .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl;
  local_70._M_t.
  super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
  .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl =
       (tuple<duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>)
       (_Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
       )0x0;
  ::std::__uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>::
  reset((__uniq_ptr_impl<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_> *
        )local_78,
        (pointer)__p._M_t.
                 super__Tuple_impl<0UL,_duckdb::WindowCollection_*,_std::default_delete<duckdb::WindowCollection>_>
                 .super__Head_base<0UL,_duckdb::WindowCollection_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::WindowCollection,_std::default_delete<duckdb::WindowCollection>_>
               *)&local_70);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            (&types.super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
  ::std::
  _Vector_base<duckdb::optional_ptr<const_duckdb::Expression,_true>,_std::allocator<duckdb::optional_ptr<const_duckdb::Expression,_true>_>_>
  ::~_Vector_base(&local_98);
  return;
}

Assistant:

WindowHashGroup::WindowHashGroup(WindowGlobalSinkState &gstate, const idx_t hash_bin_p)
    : count(0), blocks(0), stage(WindowGroupStage::SINK), hash_bin(hash_bin_p), sunk(0), finalized(0), completed(0),
      batch_base(0) {
	// There are three types of partitions:
	// 1. No partition (no sorting)
	// 2. One partition (sorting, but no hashing)
	// 3. Multiple partitions (sorting and hashing)

	//	How big is the partition?
	auto &gpart = *gstate.global_partition;
	layout.Initialize(gpart.payload_types);
	if (hash_bin < gpart.hash_groups.size() && gpart.hash_groups[hash_bin]) {
		count = gpart.hash_groups[hash_bin]->count;
	} else if (gpart.rows && !hash_bin) {
		count = gpart.count;
	} else {
		return;
	}

	//	Initialise masks to false
	partition_mask.Initialize(count);
	partition_mask.SetAllInvalid(count);

	const auto &executors = gstate.executors;
	for (auto &wexec : executors) {
		auto &wexpr = wexec->wexpr;
		auto &order_mask = order_masks[wexpr.partitions.size() + wexpr.orders.size()];
		if (order_mask.IsMaskSet()) {
			continue;
		}
		order_mask.Initialize(count);
		order_mask.SetAllInvalid(count);
	}

	// Scan the sorted data into new Collections
	external = gpart.external;
	if (gpart.rows && !hash_bin) {
		// Simple mask
		partition_mask.SetValidUnsafe(0);
		for (auto &order_mask : order_masks) {
			order_mask.second.SetValidUnsafe(0);
		}
		//	No partition - align the heap blocks with the row blocks
		rows = gpart.rows->CloneEmpty(gpart.rows->keep_pinned);
		heap = gpart.strings->CloneEmpty(gpart.strings->keep_pinned);
		RowDataCollectionScanner::AlignHeapBlocks(*rows, *heap, *gpart.rows, *gpart.strings, layout);
		external = true;
	} else if (hash_bin < gpart.hash_groups.size()) {
		// Overwrite the collections with the sorted data
		D_ASSERT(gpart.hash_groups[hash_bin].get());
		hash_group = std::move(gpart.hash_groups[hash_bin]);
		hash_group->ComputeMasks(partition_mask, order_masks);
		external = hash_group->global_sort->external;
		MaterializeSortedData();
	}

	if (rows) {
		blocks = rows->blocks.size();
	}

	// Set up the collection for any fully materialised data
	const auto &shared = WindowSharedExpressions::GetSortedExpressions(gstate.shared.coll_shared);
	vector<LogicalType> types;
	for (auto &expr : shared) {
		types.emplace_back(expr->return_type);
	}
	auto &buffer_manager = BufferManager::GetBufferManager(gstate.context);
	collection = make_uniq<WindowCollection>(buffer_manager, count, types);
}